

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int create_handshake_flow(quicly_conn_t *conn,size_t epoch)

{
  quicly_stream_t *sz;
  quicly_stream_t *in_RSI;
  uint64_t in_RDI;
  int ret;
  quicly_stream_t *unaff_retaddr;
  quicly_stream_t *stream;
  uint64_t in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  int iVar1;
  
  sz = open_stream((quicly_conn_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   in_RDI,(uint32_t)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe0);
  if (sz == (quicly_stream_t *)0x0) {
    iVar1 = 0x201;
  }
  else {
    iVar1 = quicly_streambuf_create(in_RSI,(size_t)sz);
    if (iVar1 == 0) {
      sz->callbacks = &crypto_stream_callbacks;
      iVar1 = 0;
    }
    else {
      destroy_stream(unaff_retaddr,in_stack_fffffffffffffffc);
    }
  }
  return iVar1;
}

Assistant:

static int create_handshake_flow(quicly_conn_t *conn, size_t epoch)
{
    quicly_stream_t *stream;
    int ret;

    if ((stream = open_stream(conn, -(quicly_stream_id_t)(1 + epoch), 65536, 65536)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    if ((ret = quicly_streambuf_create(stream, sizeof(quicly_streambuf_t))) != 0) {
        destroy_stream(stream, ret);
        return ret;
    }
    stream->callbacks = &crypto_stream_callbacks;

    return 0;
}